

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TgPermPhase(Abc_TgMan_t *pMan,int iVar)

{
  byte bVar1;
  int nWords_00;
  int iVar2;
  int ivp;
  int nWords;
  int iVar_local;
  Abc_TgMan_t *pMan_local;
  
  nWords_00 = Abc_TtWordNum(pMan->nVars);
  bVar1 = pMan->pPermTRev[iVar];
  Abc_TtCopy(Abc_TgPermPhase::pCopy,pMan->pTruth,nWords_00,0);
  Abc_TtFlip(Abc_TgPermPhase::pCopy,nWords_00,(int)(char)bVar1);
  iVar2 = Abc_TtCompareRev(pMan->pTruth,Abc_TgPermPhase::pCopy,nWords_00);
  if (iVar2 == 1) {
    Abc_TtCopy(pMan->pTruth,Abc_TgPermPhase::pCopy,nWords_00,0);
    pMan->uPhase = 1 << (bVar1 & 0x1f) ^ pMan->uPhase;
    pMan_local._4_4_ = 0x10;
  }
  else {
    pMan_local._4_4_ = 0;
  }
  return pMan_local._4_4_;
}

Assistant:

static int Abc_TgPermPhase(Abc_TgMan_t* pMan, int iVar)
{
    static word pCopy[1024];
    int nWords = Abc_TtWordNum(pMan->nVars);
    int ivp = pMan->pPermTRev[iVar];
    Abc_TtCopy(pCopy, pMan->pTruth, nWords, 0);
    Abc_TtFlip(pCopy, nWords, ivp);
    if (Abc_TtCompareRev(pMan->pTruth, pCopy, nWords) == 1)
    {
        Abc_TtCopy(pMan->pTruth, pCopy, nWords, 0);
        pMan->uPhase ^= 1 << ivp;
        return 16;
    }
    return 0;
}